

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O1

int If_ManCountSpecialPos(If_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  If_Par_t *pIVar7;
  ulong uVar8;
  
  pIVar7 = p->pPars;
  uVar1 = pIVar7->nLatchesCoBox;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < p->nObjs[3] - pIVar7->nLatchesCo) {
    do {
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)uVar5)) goto LAB_0043e9c0;
      puVar2 = *(uint **)((long)p->vCos->pArray[uVar5] + 0x18);
      *puVar2 = *puVar2 & 0xfffffeff;
      uVar5 = uVar5 + 1;
      pIVar7 = p->pPars;
    } while ((int)uVar5 < p->nObjs[3] - pIVar7->nLatchesCo);
  }
  uVar1 = pIVar7->nLatchesCoBox;
  uVar5 = (ulong)uVar1;
  pIVar7 = p->pPars;
  iVar6 = p->nObjs[3] - pIVar7->nLatchesCo;
  if ((int)uVar1 < iVar6) {
    do {
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)uVar5)) goto LAB_0043e9c0;
      pbVar3 = (byte *)p->vCos->pArray[uVar5];
      if ((*pbVar3 & 0x10) == 0) {
        puVar2 = *(uint **)(pbVar3 + 0x18);
        *puVar2 = *puVar2 | 0x100;
      }
      uVar5 = uVar5 + 1;
      pIVar7 = p->pPars;
      iVar6 = p->nObjs[3] - pIVar7->nLatchesCo;
    } while ((int)uVar5 < iVar6);
  }
  uVar1 = pIVar7->nLatchesCoBox;
  uVar5 = (ulong)uVar1;
  iVar4 = 0;
  if ((int)uVar1 < iVar6) {
    iVar4 = 0;
    uVar8 = uVar5;
    do {
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)uVar8)) goto LAB_0043e9c0;
      pbVar3 = (byte *)p->vCos->pArray[uVar8];
      if ((*pbVar3 & 0x10) != 0) {
        iVar4 = iVar4 + (uint)((**(uint **)(pbVar3 + 0x18) >> 8 & 1) != 0);
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < iVar6);
  }
  if ((int)uVar1 < p->nObjs[3] - p->pPars->nLatchesCo) {
    do {
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)uVar5)) {
LAB_0043e9c0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar2 = *(uint **)((long)p->vCos->pArray[uVar5] + 0x18);
      *puVar2 = *puVar2 & 0xfffffeff;
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < p->nObjs[3] - p->pPars->nLatchesCo);
  }
  return iVar4;
}

Assistant:

int If_ManCountSpecialPos( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( !If_ObjFaninC0(pObj) )
            If_ObjFanin0(pObj)->fMark = 1;
    // label nodes 
    If_ManForEachPo( p, pObj, i )
        if ( If_ObjFaninC0(pObj) )
            Counter += If_ObjFanin0(pObj)->fMark;
    // clean all marks
    If_ManForEachPo( p, pObj, i )
        If_ObjFanin0(pObj)->fMark = 0;
    return Counter;
}